

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnImportFunc
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  size_type sVar4;
  const_pointer pvVar5;
  undefined1 local_50 [8];
  string_view name;
  Index import_index_local;
  BinaryReaderObjdump *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderObjdump *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  name._M_str._4_4_ = import_index;
  PrintDetails(this," - func[%u] sig=%u",(ulong)func_index,(ulong)sig_index);
  _local_50 = BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,func_index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  if (!bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pvVar3);
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  PrintDetails(this," <- %.*s.%.*s\n",sVar2 & 0xffffffff,pvVar3,sVar4 & 0xffffffff,pvVar5);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnImportFunc(Index import_index,
                                         std::string_view module_name,
                                         std::string_view field_name,
                                         Index func_index,
                                         Index sig_index) {
  PrintDetails(" - func[%" PRIindex "] sig=%" PRIindex, func_index, sig_index);
  auto name = GetFunctionName(func_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}